

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseStorage.h
# Opt level: O0

void __thiscall
Eigen::DenseStorage<long,_-1,_-1,_3,_1>::resize
          (DenseStorage<long,__1,__1,_3,_1> *this,Index size,Index rows,Index param_3)

{
  long *plVar1;
  Index param_3_local;
  Index rows_local;
  Index size_local;
  DenseStorage<long,__1,__1,_3,_1> *this_local;
  
  if (size != this->m_rows * 3) {
    internal::conditional_aligned_delete_auto<long,true>(this->m_data,this->m_rows * 3);
    if (size == 0) {
      this->m_data = (long *)0x0;
    }
    else {
      plVar1 = internal::conditional_aligned_new_auto<long,true>(size);
      this->m_data = plVar1;
    }
  }
  this->m_rows = rows;
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void resize(Index size, Index rows, Index)
    {
      if(size != m_rows*_Cols)
      {
        internal::conditional_aligned_delete_auto<T,(_Options&DontAlign)==0>(m_data, _Cols*m_rows);
        if (size)
          m_data = internal::conditional_aligned_new_auto<T,(_Options&DontAlign)==0>(size);
        else
          m_data = 0;
        EIGEN_INTERNAL_DENSE_STORAGE_CTOR_PLUGIN({})
      }
      m_rows = rows;
    }